

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.h
# Opt level: O0

shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_> __thiscall
skiwi::make_deep_copy<skiwi::alpha_conversion_data>
          (skiwi *this,shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_> *env)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_> sVar5;
  shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_> local_38;
  __shared_ptr_access<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *local_28;
  shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_> *p_outer_copy;
  __shared_ptr_access<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *local_18;
  shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_> *env_local;
  shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_> *out;
  
  local_18 = (__shared_ptr_access<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)env;
  env_local = (shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_> *)this;
  peVar2 = std::
           __shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2>
           ::get(&env->
                  super___shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2>
                );
  if (peVar2 == (element_type *)0x0) {
    std::shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_>::shared_ptr
              ((shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_> *)this,
               (shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_> *)local_18);
    _Var4._M_pi = extraout_RDX;
  }
  else {
    p_outer_copy._7_1_ = 0;
    std::
    __shared_ptr_access<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator*(local_18);
    std::
    make_shared<skiwi::environment<skiwi::alpha_conversion_data>,skiwi::environment<skiwi::alpha_conversion_data>&>
              ((environment<skiwi::alpha_conversion_data> *)this);
    peVar3 = std::
             __shared_ptr_access<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    while( true ) {
      local_28 = (__shared_ptr_access<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&peVar3->p_outer;
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_28);
      _Var4._M_pi = extraout_RDX_00;
      if (!bVar1) break;
      std::
      make_shared<skiwi::environment<skiwi::alpha_conversion_data>,std::shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>>&>
                (&local_38);
      std::shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_>::operator=
                ((shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_> *)local_28,&local_38
                );
      std::shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_>::~shared_ptr(&local_38);
      peVar3 = std::
               __shared_ptr_access<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(local_28);
    }
  }
  sVar5.
  super___shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var4._M_pi;
  sVar5.
  super___shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_>)
         sVar5.
         super___shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::shared_ptr<environment<TEntry>> make_deep_copy(const std::shared_ptr<environment<TEntry>>& env)
  {
  if (!env.get())
    return env;
  std::shared_ptr<environment<TEntry>> out = std::make_shared<environment<TEntry>>(*env);
  //if (out->p_outer)
  //  out->p_outer = make_deep_copy(out->p_outer);
  auto* p_outer_copy = &(out->p_outer);
  while (*p_outer_copy)
    { // this loop is not tested anywhere yet
    *p_outer_copy = std::make_shared<environment<TEntry>>(*p_outer_copy);
    p_outer_copy = &((*p_outer_copy)->p_outer);
    }
  return out;
  }